

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Genetic.cpp
# Opt level: O0

Solution * Genetic::generate_child(Solution *p1,Solution *p2)

{
  size_t sVar1;
  bool bVar2;
  int iVar3;
  Solution *this;
  size_type sVar4;
  reference ppVVar5;
  Vehicle *pVVar6;
  list<std::shared_ptr<VehicleState>,_std::allocator<std::shared_ptr<VehicleState>_>_> *this_00;
  reference psVar7;
  element_type *peVar8;
  int local_ec;
  undefined1 local_e8 [4];
  int ec;
  shared_ptr<VehicleState> node;
  iterator __end2;
  iterator __begin2;
  list<std::shared_ptr<VehicleState>,_std::allocator<std::shared_ptr<VehicleState>_>_> *__range2;
  Vehicle *pVStack_b8;
  int pos;
  Vehicle *nv;
  const_iterator local_a8;
  Vehicle *local_a0;
  Vehicle *pool;
  iterator it;
  size_type total_nodes;
  Vehicle *vehicle_1;
  iterator __end1_1;
  iterator __begin1_1;
  list<Vehicle_*,_std::allocator<Vehicle_*>_> *__range1_1;
  Vehicle *local_58;
  Vehicle *vehicle;
  iterator __end1;
  iterator __begin1;
  list<Vehicle_*,_std::allocator<Vehicle_*>_> *__range1;
  list<Vehicle_*,_std::allocator<Vehicle_*>_> vehicle_pool;
  Solution *solution;
  Solution *p2_local;
  Solution *p1_local;
  
  this = (Solution *)operator_new(0x20);
  Solution::Solution(this);
  vehicle_pool.super__List_base<Vehicle_*,_std::allocator<Vehicle_*>_>._M_impl._M_node._M_size =
       (size_t)this;
  std::__cxx11::list<Vehicle_*,_std::allocator<Vehicle_*>_>::list
            ((list<Vehicle_*,_std::allocator<Vehicle_*>_> *)&__range1);
  __end1 = std::__cxx11::list<Vehicle_*,_std::allocator<Vehicle_*>_>::begin(&p1->vehicles);
  vehicle = (Vehicle *)std::__cxx11::list<Vehicle_*,_std::allocator<Vehicle_*>_>::end(&p1->vehicles)
  ;
  while (bVar2 = std::operator!=(&__end1,(_Self *)&vehicle), bVar2) {
    ppVVar5 = std::_List_iterator<Vehicle_*>::operator*(&__end1);
    local_58 = *ppVVar5;
    std::__cxx11::list<Vehicle_*,_std::allocator<Vehicle_*>_>::push_back
              ((list<Vehicle_*,_std::allocator<Vehicle_*>_> *)&__range1,&local_58);
    std::_List_iterator<Vehicle_*>::operator++(&__end1);
  }
  __end1_1 = std::__cxx11::list<Vehicle_*,_std::allocator<Vehicle_*>_>::begin(&p2->vehicles);
  vehicle_1 = (Vehicle *)
              std::__cxx11::list<Vehicle_*,_std::allocator<Vehicle_*>_>::end(&p2->vehicles);
  while (bVar2 = std::operator!=(&__end1_1,(_Self *)&vehicle_1), bVar2) {
    ppVVar5 = std::_List_iterator<Vehicle_*>::operator*(&__end1_1);
    total_nodes = (size_type)*ppVVar5;
    std::__cxx11::list<Vehicle_*,_std::allocator<Vehicle_*>_>::push_back
              ((list<Vehicle_*,_std::allocator<Vehicle_*>_> *)&__range1,(value_type *)&total_nodes);
    std::_List_iterator<Vehicle_*>::operator++(&__end1_1);
  }
  sVar4 = std::__cxx11::list<Point_*,_std::allocator<Point_*>_>::size(&Utils::raw_rows_abi_cxx11_);
  it._M_node = (_List_node_base *)(sVar4 - 1);
  while (bVar2 = std::__cxx11::list<Vehicle_*,_std::allocator<Vehicle_*>_>::empty
                           ((list<Vehicle_*,_std::allocator<Vehicle_*>_> *)&__range1),
        ((bVar2 ^ 0xffU) & 1) != 0) {
    pool = (Vehicle *)
           std::__cxx11::list<Vehicle_*,_std::allocator<Vehicle_*>_>::begin
                     ((list<Vehicle_*,_std::allocator<Vehicle_*>_> *)&__range1);
    iVar3 = rand();
    sVar4 = std::__cxx11::list<Vehicle_*,_std::allocator<Vehicle_*>_>::size
                      ((list<Vehicle_*,_std::allocator<Vehicle_*>_> *)&__range1);
    std::advance<std::_List_iterator<Vehicle*>,unsigned_long>
              ((_List_iterator<Vehicle_*> *)&pool,(ulong)(long)iVar3 % sVar4);
    ppVVar5 = std::_List_iterator<Vehicle_*>::operator*((_List_iterator<Vehicle_*> *)&pool);
    local_a0 = *ppVVar5;
    std::_List_const_iterator<Vehicle_*>::_List_const_iterator
              (&local_a8,(_List_iterator<Vehicle_*> *)&pool);
    nv = (Vehicle *)
         std::__cxx11::list<Vehicle_*,_std::allocator<Vehicle_*>_>::erase
                   ((list<Vehicle_*,_std::allocator<Vehicle_*>_> *)&__range1,local_a8);
    pVVar6 = (Vehicle *)operator_new(0x28);
    Vehicle::Vehicle(pVVar6,(Solution *)
                            vehicle_pool.super__List_base<Vehicle_*,_std::allocator<Vehicle_*>_>.
                            _M_impl._M_node._M_size);
    pVStack_b8 = pVVar6;
    std::__cxx11::list<Vehicle_*,_std::allocator<Vehicle_*>_>::push_back
              ((list<Vehicle_*,_std::allocator<Vehicle_*>_> *)
               vehicle_pool.super__List_base<Vehicle_*,_std::allocator<Vehicle_*>_>._M_impl._M_node.
               _M_size,&stack0xffffffffffffff48);
    __range2._4_4_ = 0;
    this_00 = &local_a0->nodes;
    __end2 = std::__cxx11::
             list<std::shared_ptr<VehicleState>,_std::allocator<std::shared_ptr<VehicleState>_>_>::
             begin(this_00);
    node.super___shared_ptr<VehicleState,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         std::__cxx11::
         list<std::shared_ptr<VehicleState>,_std::allocator<std::shared_ptr<VehicleState>_>_>::end
                   (this_00);
    while (bVar2 = std::operator!=(&__end2,(_Self *)&node.
                                                  super___shared_ptr<VehicleState,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount), bVar2) {
      psVar7 = std::_List_iterator<std::shared_ptr<VehicleState>_>::operator*(&__end2);
      std::shared_ptr<VehicleState>::shared_ptr((shared_ptr<VehicleState> *)local_e8,psVar7);
      sVar1 = vehicle_pool.super__List_base<Vehicle_*,_std::allocator<Vehicle_*>_>._M_impl._M_node.
              _M_size;
      peVar8 = std::__shared_ptr_access<VehicleState,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<VehicleState,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_e8);
      bVar2 = Solution::has_node((Solution *)sVar1,peVar8->p);
      pVVar6 = pVStack_b8;
      if (!bVar2) {
        local_ec = 0;
        peVar8 = std::__shared_ptr_access<VehicleState,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<VehicleState,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_e8);
        Vehicle::add_node(pVVar6,peVar8->p,__range2._4_4_,&local_ec);
        it._M_node = (_List_node_base *)((long)&it._M_node[-1]._M_prev + 7);
        __range2._4_4_ = __range2._4_4_ + 1;
      }
      std::shared_ptr<VehicleState>::~shared_ptr((shared_ptr<VehicleState> *)local_e8);
      std::_List_iterator<std::shared_ptr<VehicleState>_>::operator++(&__end2);
    }
    bVar2 = std::__cxx11::
            list<std::shared_ptr<VehicleState>,_std::allocator<std::shared_ptr<VehicleState>_>_>::
            empty(&pVStack_b8->nodes);
    if ((bVar2) &&
       (std::__cxx11::list<Vehicle_*,_std::allocator<Vehicle_*>_>::remove
                  ((list<Vehicle_*,_std::allocator<Vehicle_*>_> *)
                   vehicle_pool.super__List_base<Vehicle_*,_std::allocator<Vehicle_*>_>._M_impl.
                   _M_node._M_size,(char *)&stack0xffffffffffffff48), pVVar6 = pVStack_b8,
       pVStack_b8 != (Vehicle *)0x0)) {
      Vehicle::~Vehicle(pVStack_b8);
      operator_delete(pVVar6);
    }
  }
  Solution::total_weight
            ((Solution *)
             vehicle_pool.super__List_base<Vehicle_*,_std::allocator<Vehicle_*>_>._M_impl._M_node.
             _M_size);
  sVar1 = vehicle_pool.super__List_base<Vehicle_*,_std::allocator<Vehicle_*>_>._M_impl._M_node.
          _M_size;
  std::__cxx11::list<Vehicle_*,_std::allocator<Vehicle_*>_>::~list
            ((list<Vehicle_*,_std::allocator<Vehicle_*>_> *)&__range1);
  return (Solution *)sVar1;
}

Assistant:

Solution* Genetic::generate_child(Solution* p1, Solution* p2)
{
	auto solution = new Solution;
	//Route-Based Crossover
	std::list<Vehicle*> vehicle_pool;
	for (auto vehicle : p1->vehicles)
	{
		vehicle_pool.push_back(vehicle);
	}
	for (auto vehicle : p2->vehicles)
	{
		vehicle_pool.push_back(vehicle);
	}

	auto total_nodes = Utils::raw_rows.size() - 1;

	while (!vehicle_pool.empty())
	{
		auto it = vehicle_pool.begin();
		std::advance(it, rand() % vehicle_pool.size());
		auto pool = *it;
		vehicle_pool.erase(it);

		auto nv = new Vehicle(solution);
		solution->vehicles.push_back(nv);
		auto pos = 0;
		for (auto node : pool->nodes)
		{
			if (!solution->has_node(node->p))
			{
				auto ec = 0;
				nv->add_node(node->p, pos++, ec);
				total_nodes--;
			}
		}
		if (nv->nodes.empty())
		{
			solution->vehicles.remove(nv);
			delete nv;
		}
	}

	solution->total_weight();
	return solution;
}